

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

int Bac_ManClpObjNum(Bac_Man_t *p)

{
  int iVar1;
  int iVar2;
  Bac_Ntk_t *pBVar3;
  int local_1c;
  int i;
  Bac_Ntk_t *pNtk;
  Bac_Man_t *p_local;
  
  for (local_1c = 1; iVar1 = Bac_ManNtkNum(p), local_1c <= iVar1; local_1c = local_1c + 1) {
    pBVar3 = Bac_ManNtk(p,local_1c);
    pBVar3->Count = -1;
  }
  pBVar3 = Bac_ManRoot(p);
  iVar1 = Bac_NtkPioNum(pBVar3);
  pBVar3 = Bac_ManRoot(p);
  iVar2 = Bac_ManClpObjNum_rec(pBVar3);
  return iVar1 + iVar2;
}

Assistant:

int Bac_ManClpObjNum( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        pNtk->Count = -1;
    return Bac_NtkPioNum( Bac_ManRoot(p) ) + Bac_ManClpObjNum_rec( Bac_ManRoot(p) );
}